

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CWriteFile.cpp
# Opt level: O2

void __thiscall irr::io::CWriteFile::openFile(CWriteFile *this,bool append)

{
  char *__modes;
  FILE *__stream;
  long lVar1;
  
  if (*(int *)&(this->super_IWriteFile).field_0x10 == 0) {
    this->File = (FILE *)0x0;
  }
  else {
    __modes = "wb";
    if (append) {
      __modes = "ab";
    }
    __stream = fopen(*(char **)&(this->super_IWriteFile).field_0x8,__modes);
    this->File = (FILE *)__stream;
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      lVar1 = ftell((FILE *)this->File);
      this->FileSize = lVar1;
      fseek((FILE *)this->File,0,0);
      return;
    }
  }
  return;
}

Assistant:

void CWriteFile::openFile(bool append)
{
	if (Filename.size() == 0) {
		File = 0;
		return;
	}

	File = fopen(Filename.c_str(), append ? "ab" : "wb");

	if (File) {
		// get FileSize

		fseek(File, 0, SEEK_END);
		FileSize = ftell(File);
		fseek(File, 0, SEEK_SET);
	}
}